

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoherentElastic.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<7,_2>::CoherentElastic::~CoherentElastic(CoherentElastic *this)

{
  pointer pdVar1;
  pointer plVar2;
  
  std::vector<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>::~vector
            (&this->temperatures_);
  pdVar1 = (this->principal_).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->principal_).yValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->principal_).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->principal_).xValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  plVar2 = (this->principal_).super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)(this->principal_).super_InterpolationBase.
                                 interpolationSchemeIndices.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar2);
  }
  plVar2 = (this->principal_).super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)(this->principal_).super_InterpolationBase.boundaryIndices.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar2);
    return;
  }
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT CoherentElastic {

  /* members */
  TabulationRecord principal_;
  std::vector< ListRecord > temperatures_;

  /* auxiliary functions */
  #include "ENDFtk/section/7/2/CoherentElastic/src/generateTemperatures.hpp"
  #include "ENDFtk/section/7/2/CoherentElastic/src/verifyTemperatures.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/7/2/CoherentElastic/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the LTHR flag for coherent elastic scattering
   */
  static constexpr int LTHR() { return 1; }

  /**
   *  @brief Return the LTHR flag for coherent elastic scattering
   */
  int elasticScatteringType() const { return this->LTHR(); }

  /**
   *  @brief Return the LT flag indicating the temperature dependence (equal to
   *         NT - 1)
   */
  int LT() const { return this->principal_.L1(); }

  /**
   *  @brief Return the LT flag indicating the temperature dependence (equal to
   *         NT - 1)
   */
  int temperatureDependenceFlag() const { return this->LT(); }

  /**
   *  @brief Return the number of temperatures NT for which thermal scattering
   *         law data is given
   */
  int NT() const { return this->temperatures_.size() + 1; }

  /**
   *  @brief Return the number of temperatures NT for which thermal scattering
   *         law data is given
   */
  int numberTemperatures() const { return this->NT(); }

  /**
   *  @brief Return the number of interpolation ranges on the energy grid
   */
  long NR() const { return this->principal_.NR(); }

  /**
   *  @brief Return the number of interpolation ranges on the energy grid
   */
  long numberInterpolationRegions() const { return this->NR(); }

  /**
   *  @brief Return the number of Bragg edges, equal to the number of energy
   *         values
   */
  long NP() const { return this->principal_.NP(); }

  /**
   *  @brief Return the number of Bragg edges, equal to the number of energy
   *         values
   */
  long numberPoints() const { return this->NP(); }

  /**
   *  @brief Return the number of Bragg edges, equal to the number of energy
   *         values
   */
  long numberBraggEdges() const { return this->NP(); }

  /**
   *  @brief Return interpolation type for each range on the energy grid
   */
  auto INT() const { return this->principal_.INT(); }

  /**
   *  @brief Return interpolation type for each range on the energy grid
   */
  auto interpolants() const { return this->INT(); }

  /**
   *  @brief Return interpolation boundaries for the energy grid
   */
  auto NBT() const { return this->principal_.NBT(); }

  /**
   *  @brief Return interpolation boundaries for the energy grid
   */
  auto boundaries() const { return this->NBT(); }

  /**
   *  @brief Return all temperatures for which thermal scattering law data is
   *         given
   */
  auto T() const {

    return ranges::views::concat(
             ranges::cpp20::views::single( this->principal_.C1() ),
             this->temperatures_ |
                 ranges::cpp20::views::transform( [] ( const auto& v )
                                                     { return v.C1(); } ) );
  }

  /**
   *  @brief Return all temperatures for which thermal scattering law data is
   *         given
   */
  auto temperatures() const { return this->T(); }

  /**
   *  @brief Return the energy grid
   */
  auto E() const { return this->principal_.x(); }

  /**
   *  @brief Return the energy grid
   */
  auto energies() const { return this->E(); }

  /**
   *  @brief Return the temperature interpolation flags (LT values will be
   *         given)
   */
  auto LI() const {

    return this->temperatures_ |
               ranges::cpp20::views::transform( [] ( const auto& v )
                                                   { return v.L1(); } );
  }

  /**
   *  @brief Return the temperature interpolation flags (LT values will be
   *         given)
   */
  auto temperatureInterpolants() const { return this->LI(); }

  /**
   *  @brief Return the thermal scattering law values as an array, one for each
   *         temperature
   */
  auto S() const {

    return ranges::views::concat(
             ranges::cpp20::views::single( this->principal_.y() ),
             this->temperatures_ |
                 ranges::cpp20::views::transform( [] ( const auto& v )
                                                     { return v.list(); } ) );
  }

  /**
   *  @brief Return the thermal scattering law values as an array, one for each
   *         temperature
   */
  auto thermalScatteringValues() const { return this->S(); }

  #include "ENDFtk/section/7/2/CoherentElastic/src/NC.hpp"
  #include "ENDFtk/section/7/2/CoherentElastic/src/print.hpp"
}